

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

bool __thiscall gpu::Context::isIntelGPU(Context *this)

{
  bool bVar1;
  Data *pDVar2;
  Data *local_18;
  element_type *local_10;
  
  pDVar2 = this->data_;
  if (((pDVar2 == (Data *)0x0) &&
      (pDVar2 = (this->data_ref_).super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr, pDVar2 == (Data *)0x0)) || (pDVar2->type != TypeOpenCL)) {
    bVar1 = false;
  }
  else {
    cl((Context *)&local_18);
    bVar1 = ocl::DeviceInfo::isIntelGPU
                      ((DeviceInfo *)
                       &(local_18->ocl_engine).
                        super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (local_10 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_10);
    }
  }
  return bVar1;
}

Assistant:

bool Context::isIntelGPU()
{
	if (type() != TypeOpenCL) {
		return false;
	}

	return cl()->deviceInfo().isIntelGPU();
}